

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O2

void __thiscall
cmOrderDirectoriesConstraintSOName::Report(cmOrderDirectoriesConstraintSOName *this,ostream *e)

{
  string *psVar1;
  
  std::operator<<(e,"runtime library [");
  psVar1 = (string *)&this->SOName;
  if ((this->SOName)._M_string_length == 0) {
    psVar1 = (string *)&(this->super_cmOrderDirectoriesConstraint).FileName;
  }
  std::operator<<(e,psVar1);
  std::operator<<(e,"]");
  return;
}

Assistant:

virtual void Report(std::ostream& e)
    {
    e << "runtime library [";
    if(this->SOName.empty())
      {
      e << this->FileName;
      }
    else
      {
      e << this->SOName;
      }
    e << "]";
    }